

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

Constraint *
slang::ast::SolveBeforeConstraint::fromSyntax
          (SolveBeforeConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *compilation;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SolveBeforeConstraint *ctrl;
  SolveBeforeConstraint *pSVar2;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  SolveBeforeConstraint *args;
  bool bad;
  undefined1 local_c0 [16];
  anon_class_16_2_80a99c9f bindExprs;
  SmallVector<const_slang::ast::Expression_*,_5UL> after;
  SmallVector<const_slang::ast::Expression_*,_5UL> solve;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_20;
  
  bindExprs.bad = &bad;
  bad = false;
  compilation = ((context->scope).ptr)->compilation;
  solve.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)solve.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  solve.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  after.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)after.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  after.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  solve.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  after.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  bindExprs.context = context;
  fromSyntax(slang::syntax::SolveBeforeConstraintSyntax_const&,slang::ast::ASTContext_const&)::$_0::
  operator()(&bindExprs,&syntax->beforeExpr,&solve);
  fromSyntax(slang::syntax::SolveBeforeConstraintSyntax_const&,slang::ast::ASTContext_const&)::$_0::
  operator()(&bindExprs,&syntax->afterExpr,&after);
  local_c0._0_4_ =
       SmallVectorBase<const_slang::ast::Expression_*>::copy
                 (&solve.super_SmallVectorBase<const_slang::ast::Expression_*>,
                  (EVP_PKEY_CTX *)compilation,src);
  local_c0._4_4_ = extraout_var;
  iVar1 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (&after.super_SmallVectorBase<const_slang::ast::Expression_*>,
                     (EVP_PKEY_CTX *)compilation,src_00);
  local_20._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar1);
  args = (SolveBeforeConstraint *)local_c0;
  ctrl = BumpAllocator::
         emplace<slang::ast::SolveBeforeConstraint,std::span<slang::ast::Expression_const*,18446744073709551615ul>,std::span<slang::ast::Expression_const*,18446744073709551615ul>>
                   (&compilation->super_BumpAllocator,
                    (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)args,&local_20);
  pSVar2 = ctrl;
  if (bad == true) {
    pSVar2 = (SolveBeforeConstraint *)Constraint::badConstraint(compilation,&ctrl->super_Constraint)
    ;
    args = ctrl;
  }
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&after.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)args);
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&solve.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)args);
  return &pSVar2->super_Constraint;
}

Assistant:

Constraint& SolveBeforeConstraint::fromSyntax(const SolveBeforeConstraintSyntax& syntax,
                                              const ASTContext& context) {
    bool bad = false;
    auto bindExprs = [&](auto& list, auto& results) {
        for (auto item : list) {
            auto& expr = Expression::bind(*item, context);
            results.push_back(&expr);

            if (expr.bad()) {
                bad = true;
                continue;
            }

            auto [sym, sourceRange] = getConstraintPrimary(expr);
            if (!sym || context.getRandMode(*sym) == RandMode::None)
                context.addDiag(diag::BadSolveBefore, sourceRange);
            else if (sym && context.getRandMode(*sym) == RandMode::RandC)
                context.addDiag(diag::RandCInSolveBefore, sourceRange);
        }
    };

    auto& comp = context.getCompilation();
    SmallVector<const Expression*> solve;
    SmallVector<const Expression*> after;
    bindExprs(syntax.beforeExpr, solve);
    bindExprs(syntax.afterExpr, after);

    auto result = comp.emplace<SolveBeforeConstraint>(solve.copy(comp), after.copy(comp));
    if (bad)
        return badConstraint(comp, result);

    return *result;
}